

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::OutOfRangeException::OutOfRangeException<unsigned_long,std::__cxx11::string>
          (OutOfRangeException *this,string *msg,unsigned_long params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  pcVar1 = (params_1->_M_dataplus)._M_p;
  local_68[0] = local_58;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + params_1->_M_string_length);
  Exception::ConstructMessage<unsigned_long,std::__cxx11::string>
            (&local_48,(Exception *)msg,(string *)params,(unsigned_long)local_68,in_R8);
  OutOfRangeException(this,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return;
}

Assistant:

explicit OutOfRangeException(const string &msg, ARGS... params)
	    : OutOfRangeException(ConstructMessage(msg, params...)) {
	}